

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

void __thiscall sdf_tools::Grid::Grid(Grid *this,int3 dimensions,real3 offsets,real3 extents)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  vector<float,_std::allocator<float>_> *in_XMM2_Qa;
  undefined4 in_XMM3_Da;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffac;
  vector<float,_std::allocator<float>_> *this_00;
  
  uVar1 = in_XMM3_Da;
  this_00 = in_XMM2_Qa;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x12fa84);
  *(undefined4 *)(in_RDI + 0x20) = in_EDX;
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  *(undefined4 *)(in_RDI + 0x2c) = in_XMM1_Da;
  *(undefined8 *)(in_RDI + 0x24) = in_XMM0_Qa;
  *(undefined4 *)(in_RDI + 0x38) = in_XMM3_Da;
  *(vector<float,_std::allocator<float>_> **)(in_RDI + 0x30) = this_00;
  std::vector<float,_std::allocator<float>_>::resize
            (this_00,CONCAT44(in_stack_ffffffffffffffac,uVar1),(value_type_conflict1 *)in_XMM2_Qa);
  return;
}

Assistant:

Grid::Grid(int3 dimensions, real3 offsets, real3 extents) :
    dimensions(dimensions),
    offsets(offsets),
    extents(extents)
{
    field.resize(dimensions.x * dimensions.y * dimensions.z, 0);
}